

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerLdArrViewElem(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  IRType type;
  uint offset_00;
  JITTimeFunctionBody *pJVar3;
  undefined4 *puVar4;
  Opnd *pOVar5;
  IndirOpnd *pIVar6;
  RegOpnd *indexOpnd_00;
  Opnd *this_00;
  Opnd *src2_00;
  ThreadContextInfo *pTVar7;
  intptr_t iVar8;
  Instr *pIVar9;
  AsmJsJITInfo *this_01;
  IntConstOpnd *local_60;
  Opnd *oobValue;
  Instr *done;
  Opnd *src2;
  Opnd *src1;
  Opnd *dst;
  int32 offset;
  RegOpnd *indexOpnd;
  Instr *instrPrev;
  Instr *instr_local;
  Lowerer *this_local;
  
  pJVar3 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2515,"(m_func->GetJITFunctionBody()->IsAsmJsMode())",
                       "m_func->GetJITFunctionBody()->IsAsmJsMode()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2516,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (instr->m_opcode != LdArrViewElem) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2517,"(instr->m_opcode == Js::OpCode::LdArrViewElem)",
                       "instr->m_opcode == Js::OpCode::LdArrViewElem");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pIVar9 = instr->m_prev;
  pOVar5 = IR::Instr::GetSrc1(instr);
  pIVar6 = IR::Opnd::AsIndirOpnd(pOVar5);
  indexOpnd_00 = IR::IndirOpnd::GetIndexOpnd(pIVar6);
  pOVar5 = IR::Instr::GetSrc1(instr);
  pIVar6 = IR::Opnd::AsIndirOpnd(pOVar5);
  offset_00 = IR::IndirOpnd::GetOffset(pIVar6);
  pOVar5 = IR::Instr::GetDst(instr);
  this_00 = IR::Instr::GetSrc1(instr);
  src2_00 = IR::Instr::GetSrc2(instr);
  if ((int)offset_00 < 0) {
    bVar2 = IR::Opnd::IsFloat32(pOVar5);
    if (bVar2) {
      pTVar7 = Func::GetThreadContextInfo(this->m_func);
      iVar8 = ThreadContextInfo::GetFloatNaNAddr(pTVar7);
      local_60 = (IntConstOpnd *)
                 IR::MemRefOpnd::New(iVar8,TyFloat32,this->m_func,AddrOpndKindDynamicMisc);
    }
    else {
      bVar2 = IR::Opnd::IsFloat64(pOVar5);
      if (bVar2) {
        pTVar7 = Func::GetThreadContextInfo(this->m_func);
        iVar8 = ThreadContextInfo::GetDoubleNaNAddr(pTVar7);
        local_60 = (IntConstOpnd *)
                   IR::MemRefOpnd::New(iVar8,TyFloat64,this->m_func,AddrOpndKindDynamicMisc);
      }
      else {
        type = IR::Opnd::GetType(pOVar5);
        local_60 = IR::IntConstOpnd::New(0,type,this->m_func,false);
      }
    }
    IR::Instr::ReplaceSrc1(instr,&local_60->super_Opnd);
    if (src2_00 != (Opnd *)0x0) {
      IR::Instr::FreeSrc2(instr);
    }
    pIVar9 = LowererMD::ChangeToAssign(instr);
    return pIVar9;
  }
  if (indexOpnd_00 == (RegOpnd *)0x0) {
    pJVar3 = Func::GetJITFunctionBody(this->m_func);
    this_01 = JITTimeFunctionBody::GetAsmJsInfo(pJVar3);
    bVar2 = AsmJsJITInfo::AccessNeedsBoundCheck(this_01,offset_00);
    if (!bVar2) {
      IR::Instr::UnlinkDst(instr);
      IR::Instr::UnlinkSrc1(instr);
      oobValue = (Opnd *)instr;
      if (src2_00 != (Opnd *)0x0) {
        IR::Instr::FreeSrc2(instr);
      }
      goto LAB_0079e1c9;
    }
  }
  bVar2 = IR::Opnd::IsFloat32(pOVar5);
  if ((bVar2) && (bVar2 = IR::Opnd::IsFloat32(this_00), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2546,"(!dst->IsFloat32() || src1->IsFloat32())",
                       "!dst->IsFloat32() || src1->IsFloat32()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = IR::Opnd::IsFloat64(pOVar5);
  if ((bVar2) && (bVar2 = IR::Opnd::IsFloat64(this_00), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2547,"(!dst->IsFloat64() || src1->IsFloat64())",
                       "!dst->IsFloat64() || src1->IsFloat64()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  oobValue = (Opnd *)LowererMD::LowerAsmJsLdElemHelper(&this->m_lowererMD,instr);
LAB_0079e1c9:
  InsertMaskableMove(false,true,pOVar5,this_00,src2_00,&indexOpnd_00->super_Opnd,(Instr *)oobValue,
                     this);
  IR::Instr::Remove(instr);
  return pIVar9;
}

Assistant:

IR::Instr *
Lowerer::LowerLdArrViewElem(IR::Instr * instr)
{
#ifdef ASMJS_PLAT
    Assert(m_func->GetJITFunctionBody()->IsAsmJsMode());
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::LdArrViewElem);

    IR::Instr * instrPrev = instr->m_prev;

    IR::RegOpnd * indexOpnd = instr->GetSrc1()->AsIndirOpnd()->GetIndexOpnd();
    int32 offset = instr->GetSrc1()->AsIndirOpnd()->GetOffset();

    IR::Opnd * dst = instr->GetDst();
    IR::Opnd * src1 = instr->GetSrc1();
    IR::Opnd * src2 = instr->GetSrc2();

    IR::Instr * done;

    if (offset < 0)
    {
        IR::Opnd * oobValue = nullptr;
        if(dst->IsFloat32())
        {
            oobValue = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetFloatNaNAddr(), TyFloat32, m_func);
        }
        else if(dst->IsFloat64())
        {
            oobValue = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetDoubleNaNAddr(), TyFloat64, m_func);
        }
        else
        {
            oobValue = IR::IntConstOpnd::New(0, dst->GetType(), m_func);
        }
        instr->ReplaceSrc1(oobValue);
        if (src2)
        {
            instr->FreeSrc2();
        }
        return m_lowererMD.ChangeToAssign(instr);
    }
    if (indexOpnd || m_func->GetJITFunctionBody()->GetAsmJsInfo()->AccessNeedsBoundCheck((uint32)offset))
    {
        // CMP indexOpnd, src2(arrSize)
        // JA $helper
        // JMP $load
        // $helper:
        // MOV dst, 0
        // JMP $done
        // $load:
        // MOV dst, src1([arrayBuffer + indexOpnd])
        // $done:

        Assert(!dst->IsFloat32() || src1->IsFloat32());
        Assert(!dst->IsFloat64() || src1->IsFloat64());
        done = m_lowererMD.LowerAsmJsLdElemHelper(instr);
    }
    else
    {
        // any access below 0x10000 is safe
        instr->UnlinkDst();
        instr->UnlinkSrc1();
        if (src2)
        {
            instr->FreeSrc2();
        }
        done = instr;
    }

    InsertMaskableMove(false, true, dst, src1, src2, indexOpnd, done, this);

    instr->Remove();
    return instrPrev;
#else
    Assert(UNREACHED);
    return instr;
#endif
}